

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<const_Interface_ProblemToPolicyDiscretePure>
boost::
dynamic_pointer_cast<Interface_ProblemToPolicyDiscretePure_const,Interface_ProblemToPolicyDiscrete_const>
          (shared_ptr<const_Interface_ProblemToPolicyDiscrete> *r)

{
  shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *this;
  shared_ptr<const_Interface_ProblemToPolicyDiscrete> *r_00;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  shared_count sVar1;
  shared_ptr<const_Interface_ProblemToPolicyDiscrete> *in_RSI;
  element_type *in_RDI;
  shared_ptr<const_Interface_ProblemToPolicyDiscretePure> sVar2;
  E *p;
  
  this = (shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *)
         shared_ptr<const_Interface_ProblemToPolicyDiscrete>::get(in_RSI);
  if (this == (shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *)0x0) {
    r_00 = (shared_ptr<const_Interface_ProblemToPolicyDiscrete> *)0x0;
  }
  else {
    r_00 = (shared_ptr<const_Interface_ProblemToPolicyDiscrete> *)
           __dynamic_cast(this,&Interface_ProblemToPolicyDiscrete::typeinfo,
                          &Interface_ProblemToPolicyDiscretePure::typeinfo,0);
  }
  if (r_00 == (shared_ptr<const_Interface_ProblemToPolicyDiscrete> *)0x0) {
    shared_ptr<const_Interface_ProblemToPolicyDiscretePure>::shared_ptr
              ((shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *)0x8cb5cf);
    sVar1.pi_ = extraout_RDX_00;
  }
  else {
    shared_ptr<Interface_ProblemToPolicyDiscretePure_const>::
    shared_ptr<Interface_ProblemToPolicyDiscrete_const>(this,r_00,(element_type *)0x8cb5c3);
    sVar1.pi_ = extraout_RDX;
  }
  sVar2.pn.pi_ = sVar1.pi_;
  sVar2.px = in_RDI;
  return sVar2;
}

Assistant:

shared_ptr<T> dynamic_pointer_cast( shared_ptr<U> const & r ) BOOST_NOEXCEPT
{
    (void) dynamic_cast< T* >( static_cast< U* >( 0 ) );

    typedef typename shared_ptr<T>::element_type E;

    E * p = dynamic_cast< E* >( r.get() );
    return p? shared_ptr<T>( r, p ): shared_ptr<T>();
}